

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# common.cpp
# Opt level: O0

bool readFromFile<float,float>(string *fname,TWaveformT<float> *res)

{
  byte bVar1;
  bool bVar2;
  _Ios_Openmode _Var3;
  streamoff sVar4;
  string *in_RDI;
  undefined1 auVar5 [16];
  streamsize size;
  ifstream fin;
  undefined7 in_stack_fffffffffffffd88;
  undefined1 in_stack_fffffffffffffd8f;
  undefined1 local_248 [16];
  streamoff local_238;
  undefined4 local_230;
  undefined1 local_220 [543];
  byte local_1;
  
  _Var3 = std::operator|(_S_bin,_S_ate);
  std::ifstream::ifstream(local_220,in_RDI,_Var3);
  bVar1 = std::ios::good();
  if ((bVar1 & 1) == 0) {
    local_1 = 0;
  }
  else {
    auVar5 = std::istream::tellg();
    local_248 = auVar5;
    sVar4 = std::fpos::operator_cast_to_long((fpos *)local_248);
    local_238 = sVar4;
    std::istream::seekg((long)local_220,_S_beg);
    bVar2 = (anonymous_namespace)::readWaveform<float,float>
                      (auVar5._0_8_,auVar5._8_8_,(int32_t)((ulong)sVar4 >> 0x20),
                       CONCAT17(in_stack_fffffffffffffd8f,in_stack_fffffffffffffd88));
    if (bVar2) {
      std::ifstream::close();
      local_1 = 1;
    }
    else {
      local_1 = 0;
    }
  }
  local_230 = 1;
  std::ifstream::~ifstream(local_220);
  return (bool)(local_1 & 1);
}

Assistant:

bool readFromFile(const std::string & fname, TWaveformT<TSample> & res) {
    std::ifstream fin(fname, std::ios::binary | std::ios::ate);
    if (fin.good() == false) {
        return false;
    }

    {
        std::streamsize size = fin.tellg();
        fin.seekg(0, std::ios::beg);

        static_assert(std::is_same<TSampleInput, TSampleF>::value, "TSampleInput not supported");
        static_assert(std::is_same<TSample, TSampleF>::value ||
                      std::is_same<TSample, TSampleI16>::value, "TSample not supported");

        if (readWaveform<TSampleInput>(fin, res, 0, size) == false) {
            return false;
        }
    }

    fin.close();

    return true;
}